

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SrcListIndexedBy(Parse *pParse,SrcList *p,Token *pIndexedBy)

{
  undefined1 *puVar1;
  uint uVar2;
  char *pcVar3;
  
  if ((p != (SrcList *)0x0) && (0 < p->nSrc)) {
    uVar2 = p->nSrc - 1;
    if ((pIndexedBy->n == 1) && (pIndexedBy->z == (char *)0x0)) {
      puVar1 = &p->a[uVar2].fg.field_0x1;
      *puVar1 = *puVar1 | 1;
    }
    else {
      pcVar3 = sqlite3NameFromToken(pParse->db,pIndexedBy);
      p->a[uVar2].u1.zIndexedBy = pcVar3;
      p->a[uVar2].fg.field_0x1 = p->a[uVar2].fg.field_0x1 & 0xfd | (pcVar3 != (char *)0x0) * '\x02';
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListIndexedBy(Parse *pParse, SrcList *p, Token *pIndexedBy){
  assert( pIndexedBy!=0 );
  if( p && ALWAYS(p->nSrc>0) ){
    struct SrcList_item *pItem = &p->a[p->nSrc-1];
    assert( pItem->fg.notIndexed==0 );
    assert( pItem->fg.isIndexedBy==0 );
    assert( pItem->fg.isTabFunc==0 );
    if( pIndexedBy->n==1 && !pIndexedBy->z ){
      /* A "NOT INDEXED" clause was supplied. See parse.y 
      ** construct "indexed_opt" for details. */
      pItem->fg.notIndexed = 1;
    }else{
      pItem->u1.zIndexedBy = sqlite3NameFromToken(pParse->db, pIndexedBy);
      pItem->fg.isIndexedBy = (pItem->u1.zIndexedBy!=0);
    }
  }
}